

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  undefined8 *__s1;
  undefined8 *__s1_00;
  char *pcVar5;
  size_t sVar6;
  undefined8 uVar7;
  slab_cache *size;
  size_t sVar8;
  bool bVar9;
  char *pcVar10;
  region local_398;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined4 local_338;
  undefined1 local_80 [8];
  region region;
  
  plan(6);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","main");
  uVar3 = time((time_t *)0x0);
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"random seed is %u",uVar3 & 0xffffffff);
  fputc(10,_stdout);
  srand((uint)uVar3);
  quota.value = 0x40000000000000;
  slab_arena_create(&arena,&quota,0,4000000,2);
  slab_cache_create(&cache,&arena);
  region_basic();
  region_test_truncate();
  region_test_callbacks();
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","region_test_join");
  region.cache = (slab_cache *)&region;
  local_80 = (undefined1  [8])&cache;
  region.slabs.slabs.next = (rlist *)0x0;
  region.slabs.stats.used = 0;
  region.slabs.stats.total = 0;
  region.on_alloc_cb = (region_on_alloc_f)0x0;
  region.on_truncate_cb = (region_on_truncate_f)0x0;
  region.cb_arg = (void *)0x0;
  uVar3 = 0;
  region.slabs.slabs.prev = (rlist *)region.cache;
  while ((int)uVar3 != 0xd9) {
    region.reserved = uVar3;
    iVar1 = rand();
    iVar1 = iVar1 % 99;
    if (iVar1 < 0) {
      iVar1 = -1;
    }
    sVar8 = 0;
    uVar3 = 0;
    while (iVar1 + 1 != uVar3) {
      iVar2 = rand();
      size = (slab_cache *)(long)(iVar2 % 0x309 + 1);
      pvVar4 = region_alloc((region *)local_80,(size_t)size);
      if (pvVar4 == (void *)0x0) {
        pcVar10 = "region_test_join";
        pcVar5 = "ptr != NULL";
        uVar7 = 0xb2;
        goto LAB_00103488;
      }
      memset(pvVar4,(int)(uVar3 + 1),(size_t)size);
      (&local_398.cache)[uVar3] = size;
      sVar8 = (long)size->orders + (sVar8 - 0x30);
      uVar3 = uVar3 + 1;
    }
    pcVar5 = (char *)region_join((region *)local_80,sVar8);
    if (pcVar5 == (char *)0x0) {
      pcVar10 = "region_test_join";
      pcVar5 = "ptr != NULL";
      uVar7 = 0xb8;
      goto LAB_00103488;
    }
    uVar3 = 0;
    while (uVar3 != iVar1 + 1) {
      pcVar10 = pcVar5 + (long)(&local_398.cache)[uVar3];
      uVar3 = uVar3 + 1;
      for (; pcVar5 < pcVar10; pcVar5 = pcVar5 + 1) {
        if (uVar3 != (uint)(int)*pcVar5) {
          pcVar10 = "region_test_join";
          pcVar5 = "*ptr == j + 1";
          uVar7 = 0xbb;
          goto LAB_00103488;
        }
      }
    }
    uVar3 = (ulong)((int)region.reserved + 1);
  }
  region_free((region *)local_80);
  sVar8 = 0;
  _ok(1,"true","/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/region.c",
      0xbf,"line %d",0xbf);
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","region_test_join");
  check_plan();
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","region_test_alignment");
  local_398.slabs.slabs.prev = &local_398.slabs.slabs;
  local_398.cache = &cache;
  local_398.slabs.stats.used = 0;
  local_398.slabs.stats.total = 0;
  local_398.on_alloc_cb = (region_on_alloc_f)0x0;
  local_398.on_truncate_cb = (region_on_truncate_f)0x0;
  local_398.cb_arg = (void *)0x0;
  local_398.reserved = 0;
  iVar1 = 9999;
  local_398.slabs.slabs.next = local_398.slabs.slabs.prev;
LAB_00103148:
  do {
    bVar9 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar9) {
      region_free(&local_398);
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/region.c",0xea,
          "line %d",0xea);
      _space((FILE *)_stdout);
      printf("# *** %s: done ***\n","region_test_alignment");
      check_plan();
      plan(2);
      _space((FILE *)_stdout);
      printf("# *** %s ***\n","region_test_poison");
      local_80 = (undefined1  [8])&cache;
      region.cache = (slab_cache *)&region;
      region.slabs.slabs.next = (rlist *)0x0;
      region.slabs.stats.used = 0;
      region.slabs.stats.total = 0;
      region.on_alloc_cb = (region_on_alloc_f)0x0;
      region.on_truncate_cb = (region_on_truncate_f)0x0;
      region.cb_arg = (void *)0x0;
      local_348 = 0x5050505050505050;
      uStack_340 = 0x5050505050505050;
      local_398.reserved = 0x5050505050505050;
      uStack_350 = 0x5050505050505050;
      local_398.on_truncate_cb = (region_on_truncate_f)0x5050505050505050;
      local_398.cb_arg = (void *)0x5050505050505050;
      local_398.slabs.stats.total = 0x5050505050505050;
      local_398.on_alloc_cb = (region_on_alloc_f)0x5050505050505050;
      local_398.slabs.slabs.next = (rlist *)0x5050505050505050;
      local_398.slabs.stats.used = 0x5050505050505050;
      local_398.cache = (slab_cache *)0x5050505050505050;
      local_398.slabs.slabs.prev = (rlist *)0x5050505050505050;
      local_338 = 0x50505050;
      region.slabs.slabs.prev = (rlist *)region.cache;
      region_reserve((region *)local_80,100);
      __s1 = (undefined8 *)region_alloc((region *)local_80,10);
      if (__s1 == (undefined8 *)0x0) {
        pcVar10 = "region_test_poison";
        pcVar5 = "ptr1 != NULL";
        uVar7 = 0x100;
      }
      else {
        *(undefined2 *)(__s1 + 1) = 0;
        *__s1 = 0;
        __s1_00 = (undefined8 *)region_alloc((region *)local_80,0x5a);
        if (__s1_00 != (undefined8 *)0x0) {
          *(undefined8 *)((long)__s1_00 + 0x4a) = 0;
          *(undefined8 *)((long)__s1_00 + 0x52) = 0;
          __s1_00[8] = 0;
          __s1_00[9] = 0;
          __s1_00[6] = 0;
          __s1_00[7] = 0;
          __s1_00[4] = 0;
          __s1_00[5] = 0;
          __s1_00[2] = 0;
          __s1_00[3] = 0;
          *__s1_00 = 0;
          __s1_00[1] = 0;
          region_truncate((region *)local_80,10);
          iVar1 = bcmp(__s1_00,&local_398,0x5a);
          _ok((uint)(iVar1 == 0),"memcmp(ptr2, pattern, 90) == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/region.c",
              0x107,"line %d",0x107);
          region_truncate((region *)local_80,0);
          iVar1 = bcmp(__s1,&local_398,10);
          _ok((uint)(iVar1 == 0),"memcmp(ptr1, pattern, 10) == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/region.c",
              0x10a,"line %d",0x10a);
          _space((FILE *)_stdout);
          printf("# *** %s: done ***\n","region_test_poison");
          check_plan();
          slab_cache_destroy(&cache);
          _space((FILE *)_stdout);
          printf("# *** %s: done ***\n","main");
          iVar1 = check_plan();
          return iVar1;
        }
        pcVar10 = "region_test_poison";
        pcVar5 = "ptr2 != NULL";
        uVar7 = 0x103;
      }
LAB_00103488:
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar5,"false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/region.c",
              uVar7,pcVar10);
      exit(-1);
    }
    iVar2 = rand();
    sVar6 = local_398.slabs.stats.used;
    if (iVar2 % 7 != 1) {
      if (iVar2 % 7 == 0) {
        iVar2 = rand();
        sVar6 = (size_t)(iVar2 % 0x14d + 1);
        pvVar4 = region_alloc(&local_398,sVar6);
        if (pvVar4 == (void *)0x0) {
          pcVar10 = "region_test_alignment";
          pcVar5 = "ptr != NULL";
          uVar7 = 0xd3;
          goto LAB_00103488;
        }
        sVar8 = sVar8 + sVar6;
      }
      else {
        iVar2 = rand();
        uVar3 = (ulong)(uint)(2 << ((byte)(iVar2 % 5) & 0x1f));
        iVar2 = rand();
        pvVar4 = region_aligned_alloc(&local_398,(long)(iVar2 % 0x14d + 1),uVar3);
        if (pvVar4 == (void *)0x0) {
          pcVar10 = "region_test_alignment";
          pcVar5 = "ptr != NULL";
          uVar7 = 0xe3;
          goto LAB_00103488;
        }
        if ((uVar3 - 1 & (ulong)pvVar4) != 0) {
          pcVar10 = "region_test_alignment";
          pcVar5 = "(uintptr_t)ptr % alignment == 0";
          uVar7 = 0xe4;
          goto LAB_00103488;
        }
        sVar8 = (sVar8 - sVar6) + local_398.slabs.stats.used;
      }
      goto LAB_00103148;
    }
    if (sVar8 != 0) {
      pvVar4 = region_join(&local_398,sVar8);
      if (pvVar4 == (void *)0x0) {
        pcVar10 = "region_test_alignment";
        pcVar5 = "ptr != NULL";
        uVar7 = 0xda;
        goto LAB_00103488;
      }
    }
    sVar8 = 0;
  } while( true );
}

Assistant:

int main()
{
#ifdef ENABLE_ASAN
	plan(8);
#else
#ifndef NDEBUG
	plan(6);
#else
	plan(5);
#endif
#endif
	header();

	unsigned int seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);
	quota_init(&quota, UINT_MAX);
	slab_arena_create(&arena, &quota, 0,
			  4000000, MAP_PRIVATE);
	slab_cache_create(&cache, &arena);

	region_basic();
	region_test_truncate();
	region_test_callbacks();
	region_test_join();
	region_test_alignment();
#ifndef ENABLE_ASAN
#ifndef NDEBUG
	region_test_poison();
#endif
#else
	region_test_poison();
	region_test_tiny_reserve_size();
	region_test_truncate_reserved();
#endif

	slab_cache_destroy(&cache);

	footer();
	return check_plan();
}